

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O3

void __thiscall XmlRpc::XmlRpcValue::assertStruct(XmlRpcValue *this)

{
  pointer *ppcVar1;
  BinaryData *pBVar2;
  string *psVar3;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->_type != TypeStruct) {
    if (this->_type != TypeInvalid) {
      psVar3 = (string *)__cxa_allocate_exception(0x28);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"type error: expected a struct","");
      *(string **)psVar3 = psVar3 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar3,local_40,local_40 + local_38);
      *(undefined4 *)(psVar3 + 0x20) = 0xffffffff;
      __cxa_throw(psVar3,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
    }
    this->_type = TypeStruct;
    pBVar2 = (BinaryData *)operator_new(0x30);
    ppcVar1 = &(pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pBVar2[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pBVar2[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppcVar1;
    pBVar2[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)ppcVar1;
    pBVar2[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (this->_value).asBinary = pBVar2;
  }
  return;
}

Assistant:

void XmlRpcValue::assertStruct()
  {
    if (_type == TypeInvalid) {
      _type = TypeStruct;
      _value.asStruct = new ValueStruct();
    } else if (_type != TypeStruct)
      throw XmlRpcException("type error: expected a struct");
  }